

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskController.hpp
# Opt level: O1

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>
::disk_controller_did_change_paged_item
          (ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>
           *this,DiskController *controller)

{
  pointer puVar1;
  
  if (controller->paged_item_ == DiskROM) {
    puVar1 = (this->disk_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->ram_top_ =
         ~((short)*(undefined4 *)
                   &(this->disk_rom_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (short)puVar1);
    this->paged_rom_ = puVar1;
    return;
  }
  if (controller->paged_item_ == RAM) {
    this->ram_top_ = this->basic_invisible_ram_top_;
    return;
  }
  this->ram_top_ = this->basic_visible_ram_top_;
  this->paged_rom_ =
       (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  return;
}

Assistant:

inline PagedItem get_paged_item() {
			return paged_item_;
		}